

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sOcclusionQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::OcclusionQueryStressCase::iterate(OcclusionQueryStressCase *this)

{
  allocator<unsigned_int> *this_00;
  value_type vVar1;
  GLuint GVar2;
  GLsizei n;
  deUint32 dVar3;
  GLint location;
  deBool dVar4;
  GLenum GVar5;
  TestLog *log_00;
  char *pcVar6;
  MessageBuilder *pMVar7;
  reference pvVar8;
  TestError *pTVar9;
  reference pvVar10;
  qpWatchDog *pqVar11;
  deUint64 dVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  MessageBuilder local_6a8;
  int local_524;
  ulong uStack_520;
  int queryIter_1;
  MessageBuilder local_518;
  ulong local_398;
  deUint64 dTime;
  int local_388;
  int drawIter_1;
  int drawIter;
  int queryIter;
  deUint64 time;
  int local_370;
  int vtxNdx_1;
  int i_2;
  int vtxNdx;
  int i_1;
  int i;
  int numTargetIndicesPerDraw;
  int numOccluderIndicesPerDraw;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  ScopedLogSection local_188;
  ScopedLogSection section;
  int local_15c;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string sectionName;
  undefined1 local_d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryResult;
  undefined1 local_b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryResultReady;
  allocator<unsigned_int> local_85;
  value_type_conflict4 local_84;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryIds;
  vector<float,_std::allocator<float>_> targetVertices;
  vector<float,_std::allocator<float>_> occluderVertices;
  vector<float,_std::allocator<float>_> vertices;
  deUint32 colorUnif;
  TestLog *log;
  OcclusionQueryStressCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  location = glwGetUniformLocation(dVar3,"u_color");
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  iVar13 = this->m_numQueries;
  local_84 = 0;
  std::allocator<unsigned_int>::allocator(&local_85);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,(long)iVar13,&local_84,
             &local_85);
  std::allocator<unsigned_int>::~allocator(&local_85);
  iVar13 = this->m_numQueries;
  queryResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_00 = (allocator<unsigned_int> *)
            ((long)&queryResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,(long)iVar13,
             (value_type_conflict4 *)
             ((long)&queryResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&queryResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  iVar13 = this->m_numQueries;
  sectionName.field_2._12_4_ = 0;
  std::allocator<unsigned_int>::allocator
            ((allocator<unsigned_int> *)(sectionName.field_2._M_local_buf + 0xb));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,(long)iVar13,
             (value_type_conflict4 *)(sectionName.field_2._M_local_buf + 0xc),
             (allocator<unsigned_int> *)(sectionName.field_2._M_local_buf + 0xb));
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)(sectionName.field_2._M_local_buf + 0xb));
  local_15c = this->m_iterNdx + 1;
  de::toString<int>(&local_158,&local_15c);
  std::operator+(&local_138,"Case iteration ",&local_158);
  std::operator+(&local_118,&local_138,"/");
  de::toString<int>((string *)&section,&NUM_CASE_ITERATIONS);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 &local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar6,&local_1a9);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar6,&local_1d1);
  tcu::ScopedLogSection::ScopedLogSection(&local_188,log_00,&local_1a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&numTargetIndicesPerDraw,log_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&numTargetIndicesPerDraw,(char (*) [13])"Parameters:\n");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [32])"- Number of occlusion queries: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numQueries);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c89945);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(char (*) [39])"- Number of occluder draws per query: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numOccluderDraws);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [24])", primitives per draw: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numOccludersPerDraw);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c89945);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(char (*) [37])"- Number of target draws per query: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numTargetDraws);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [24])", primitives per draw: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numTargetsPerDraw);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c89945);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&numTargetIndicesPerDraw);
  i = this->m_numOccludersPerDraw * 3;
  i_1 = this->m_numTargetsPerDraw * 3;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,400);
  for (vtxNdx = 0; vtxNdx < 100; vtxNdx = vtxNdx + 1) {
    fVar14 = de::Random::getFloat(&this->m_rnd,-1.0,1.0);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx << 2));
    *pvVar8 = fVar14;
    fVar14 = de::Random::getFloat(&this->m_rnd,-1.0,1.0);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx * 4 + 1));
    *pvVar8 = fVar14;
    fVar14 = de::Random::getFloat(&this->m_rnd,0.0,1.0);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx * 4 + 2));
    *pvVar8 = fVar14;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx * 4 + 3));
    *pvVar8 = 1.0;
  }
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)(i * this->m_numOccluderDraws * 4));
  for (i_2 = 0; i_2 < i * this->m_numOccluderDraws; i_2 = i_2 + 1) {
    vtxNdx_1 = de::Random::getInt(&this->m_rnd,0,99);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx_1 << 2));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(i_2 << 2));
    *pvVar8 = vVar1;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx_1 * 4 + 1));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(i_2 * 4 + 1));
    *pvVar8 = vVar1;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx_1 * 4 + 2));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(i_2 * 4 + 2));
    *pvVar8 = vVar1;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(vtxNdx_1 * 4 + 3));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(i_2 * 4 + 3));
    *pvVar8 = vVar1;
  }
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)(i_1 * this->m_numTargetDraws * 4));
  for (local_370 = 0; local_370 < i_1 * this->m_numTargetDraws; local_370 = local_370 + 1) {
    time._4_4_ = de::Random::getInt(&this->m_rnd,0,99);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(time._4_4_ << 2));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_370 << 2));
    *pvVar8 = vVar1;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(time._4_4_ * 4 + 1));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_370 * 4 + 1)
                       );
    *pvVar8 = vVar1;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(time._4_4_ * 4 + 2));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_370 * 4 + 2)
                       );
    *pvVar8 = vVar1;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(time._4_4_ * 4 + 3));
    vVar1 = *pvVar8;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_370 * 4 + 3)
                       );
    *pvVar8 = vVar1;
  }
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (this->m_program != (ShaderProgram *)0x0))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      glwClearColor(0.0,0.0,0.0,1.0);
      glwClearDepthf(1.0);
      glwClear(0x4100);
      glwEnable(0xb71);
      dVar3 = glu::ShaderProgram::getProgram(this->m_program);
      glwUseProgram(dVar3);
      glwEnableVertexAttribArray(0);
      _drawIter = deGetMicroseconds();
      for (drawIter_1 = 0; drawIter_1 < this->m_numQueries; drawIter_1 = drawIter_1 + 1) {
        fVar14 = tcu::Vector<float,_4>::x((Vector<float,_4> *)OCCLUDER_COLOR);
        fVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)OCCLUDER_COLOR);
        fVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)OCCLUDER_COLOR);
        fVar17 = tcu::Vector<float,_4>::w((Vector<float,_4> *)OCCLUDER_COLOR);
        glwUniform4f(location,fVar14,fVar15,fVar16,fVar17);
        for (local_388 = 0; local_388 < this->m_numOccluderDraws; local_388 = local_388 + 1) {
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)
                              &targetVertices.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)(local_388 * i));
          glwVertexAttribPointer(0,4,0x1406,'\0',0,pvVar8);
          glwDrawArrays(4,0,i);
        }
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                             (long)drawIter_1);
        glwGenQueries(1,pvVar10);
        GVar5 = this->m_queryMode;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                             (long)drawIter_1);
        glwBeginQuery(GVar5,*pvVar10);
        fVar14 = tcu::Vector<float,_4>::x((Vector<float,_4> *)TARGET_COLOR);
        fVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)TARGET_COLOR);
        fVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)TARGET_COLOR);
        fVar17 = tcu::Vector<float,_4>::w((Vector<float,_4> *)TARGET_COLOR);
        glwUniform4f(location,fVar14,fVar15,fVar16,fVar17);
        for (dTime._4_4_ = 0; dTime._4_4_ < this->m_numTargetDraws; dTime._4_4_ = dTime._4_4_ + 1) {
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)
                              &queryIds.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)(dTime._4_4_ * i_1));
          glwVertexAttribPointer(0,4,0x1406,'\0',0,pvVar8);
          glwDrawArrays(4,0,i_1);
        }
        glwEndQuery(this->m_queryMode);
        if ((drawIter_1 % 0x32 == 0) &&
           (pqVar11 = tcu::TestContext::getWatchDog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx),
           pqVar11 != (qpWatchDog *)0x0)) {
          pqVar11 = tcu::TestContext::getWatchDog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          qpWatchDog_touch(pqVar11);
        }
      }
      glwFinish();
      glwDisable(0xb71);
      dVar12 = deGetMicroseconds();
      local_398 = dVar12 - _drawIter;
      tcu::TestLog::operator<<(&local_518,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_518,(char (*) [17])"Total duration: ");
      uStack_520 = local_398 / 1000;
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xfffffffffffffae0);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])" ms");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_518);
      local_524 = 0;
      while( true ) {
        if (this->m_numQueries <= local_524) {
          n = this->m_numQueries;
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,0);
          glwDeleteQueries(n,pvVar10);
          GVar5 = glwGetError();
          glu::checkError(GVar5,"Occlusion queries finished",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
                          ,0x114);
          tcu::TestLog::operator<<(&local_6a8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<(&local_6a8,(char (*) [13])"Case passed!");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_6a8);
          iVar13 = this->m_iterNdx + 1;
          this->m_iterNdx = iVar13;
          tcu::ScopedLogSection::~ScopedLogSection(&local_188);
          std::__cxx11::string::~string((string *)local_f8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     &occluderVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          return (uint)(iVar13 < 3);
        }
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                             (long)local_524);
        GVar2 = *pvVar10;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,
                             (long)local_524);
        glwGetQueryObjectuiv(GVar2,0x8867,pvVar10);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,
                             (long)local_524);
        if (*pvVar10 != 1) break;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                             (long)local_524);
        GVar2 = *pvVar10;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,
                             (long)local_524);
        glwGetQueryObjectuiv(GVar2,0x8866,pvVar10);
        if ((local_524 % 0x32 == 0) &&
           (pqVar11 = tcu::TestContext::getWatchDog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx),
           pqVar11 != (qpWatchDog *)0x0)) {
          pqVar11 = tcu::TestContext::getWatchDog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          qpWatchDog_touch(pqVar11);
        }
        local_524 = local_524 + 1;
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Occlusion query failed to return a result after glFinish()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
                 ,0x10d);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,"m_program",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
             ,0xce);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

OcclusionQueryStressCase::IterateResult OcclusionQueryStressCase::iterate (void)
{
	tcu::TestLog&				log				 = m_testCtx.getLog();
	deUint32					colorUnif		 = glGetUniformLocation(m_program->getProgram(), "u_color");

	std::vector<float>			vertices;
	std::vector<float>			occluderVertices;
	std::vector<float>			targetVertices;
	std::vector<deUint32>		queryIds		 (m_numQueries, 0);
	std::vector<deUint32>		queryResultReady (m_numQueries, 0);
	std::vector<deUint32>		queryResult		 (m_numQueries, 0);

	std::string					sectionName		("Case iteration " + de::toString(m_iterNdx+1) + "/" + de::toString(NUM_CASE_ITERATIONS));
	tcu::ScopedLogSection		section			(log, sectionName.c_str(), sectionName.c_str());

	log << tcu::TestLog::Message << "Parameters:\n"
								 << "- Number of occlusion queries: "		 << m_numQueries		<< ".\n"
								 << "- Number of occluder draws per query: " << m_numOccluderDraws	<< ", primitives per draw: " << m_numOccludersPerDraw << ".\n"
								 << "- Number of target draws per query: "	 << m_numTargetDraws	<< ", primitives per draw: " << m_numTargetsPerDraw	  << ".\n"
		<< tcu::TestLog::EndMessage;

	int numOccluderIndicesPerDraw = 3*m_numOccludersPerDraw;
	int numTargetIndicesPerDraw = 3*m_numTargetsPerDraw;

	// Generate vertex data

	vertices.resize(4*NUM_GENERATED_VERTICES);

	for (int i = 0; i < NUM_GENERATED_VERTICES; i++)
	{
		vertices[4*i    ] = m_rnd.getFloat(-1.0f, 1.0f);
		vertices[4*i + 1] = m_rnd.getFloat(-1.0f, 1.0f);
		vertices[4*i + 2] = m_rnd.getFloat(0.0f, 1.0f);
		vertices[4*i + 3] = 1.0f;
	}

	// Generate primitives

	occluderVertices.resize(4*numOccluderIndicesPerDraw * m_numOccluderDraws);

	for (int i = 0; i < numOccluderIndicesPerDraw * m_numOccluderDraws; i++)
	{
		int vtxNdx = m_rnd.getInt(0, NUM_GENERATED_VERTICES-1);
		occluderVertices[4*i    ] = vertices[4*vtxNdx];
		occluderVertices[4*i + 1] = vertices[4*vtxNdx + 1];
		occluderVertices[4*i + 2] = vertices[4*vtxNdx + 2];
		occluderVertices[4*i + 3] = vertices[4*vtxNdx + 3];
	}

	targetVertices.resize(4*numTargetIndicesPerDraw * m_numTargetDraws);

	for (int i = 0; i < numTargetIndicesPerDraw * m_numTargetDraws; i++)
	{
		int vtxNdx = m_rnd.getInt(0, NUM_GENERATED_VERTICES-1);
		targetVertices[4*i    ] = vertices[4*vtxNdx];
		targetVertices[4*i + 1] = vertices[4*vtxNdx + 1];
		targetVertices[4*i + 2] = vertices[4*vtxNdx + 2];
		targetVertices[4*i + 3] = vertices[4*vtxNdx + 3];
	}

	TCU_CHECK(m_program);

	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glClearDepthf				(1.0f);
	glClear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	glEnable					(GL_DEPTH_TEST);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(0);

	deUint64 time = deGetMicroseconds();

	for (int queryIter = 0; queryIter < m_numQueries; queryIter++)
	{
		// Draw occluders

		glUniform4f	(colorUnif, OCCLUDER_COLOR.x(), OCCLUDER_COLOR.y(), OCCLUDER_COLOR.z(), OCCLUDER_COLOR.w());

		for (int drawIter = 0; drawIter < m_numOccluderDraws; drawIter++)
		{
			glVertexAttribPointer	(0, 4, GL_FLOAT, GL_FALSE, 0, &occluderVertices[drawIter * numOccluderIndicesPerDraw]);
			glDrawArrays			(GL_TRIANGLES, 0, numOccluderIndicesPerDraw);
		}

		// Begin occlusion query

		glGenQueries	(1, &queryIds[queryIter]);
		glBeginQuery	(m_queryMode, queryIds[queryIter]);

		// Draw targets

		glUniform4f	(colorUnif, TARGET_COLOR.x(), TARGET_COLOR.y(), TARGET_COLOR.z(), TARGET_COLOR.w());

		for (int drawIter = 0; drawIter < m_numTargetDraws; drawIter++)
		{
			glVertexAttribPointer	(0, 4, GL_FLOAT, GL_FALSE, 0, &targetVertices[drawIter * numTargetIndicesPerDraw]);
			glDrawArrays			(GL_TRIANGLES, 0, numTargetIndicesPerDraw);
		}

		// End occlusion query

		glEndQuery		(m_queryMode);

		if ((queryIter % WATCHDOG_INTERVAL) == 0 && m_testCtx.getWatchDog())
			qpWatchDog_touch(m_testCtx.getWatchDog());
	}

	glFinish();
	glDisable(GL_DEPTH_TEST);

	deUint64 dTime = deGetMicroseconds() - time;
	log << tcu::TestLog::Message << "Total duration: " << dTime/1000 << " ms" << tcu::TestLog::EndMessage;

	// Get results

	for (int queryIter = 0; queryIter < m_numQueries; queryIter++)
	{
		glGetQueryObjectuiv(queryIds[queryIter], GL_QUERY_RESULT_AVAILABLE, &queryResultReady[queryIter]);

		if (queryResultReady[queryIter] == GL_TRUE)
		{
			glGetQueryObjectuiv(queryIds[queryIter], GL_QUERY_RESULT, &queryResult[queryIter]);
		}
		else
			TCU_FAIL("Occlusion query failed to return a result after glFinish()");

		if ((queryIter % WATCHDOG_INTERVAL) == 0 && m_testCtx.getWatchDog())
			qpWatchDog_touch(m_testCtx.getWatchDog());
	}

	glDeleteQueries	(m_numQueries, &queryIds[0]);
	GLU_CHECK_MSG	("Occlusion queries finished");

	log << tcu::TestLog::Message << "Case passed!" << tcu::TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}